

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall
net_tests::cnetaddr_tostring_canonical_ipv6::test_method(cnetaddr_tostring_canonical_ipv6 *this)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  iterator pvVar5;
  allocator_type *__a;
  iterator in_R9;
  iterator pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar8;
  undefined8 in_stack_fffffffffffff468;
  undefined **in_stack_fffffffffffff470;
  bool in_stack_fffffffffffff478;
  undefined7 in_stack_fffffffffffff479;
  undefined1 *in_stack_fffffffffffff480;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  _Any_data local_b20;
  code *local_b10;
  _Rb_tree_node_base *local_b00;
  assertion_result local_af8;
  _Rb_tree_node_base **local_ae0;
  string *local_ad8;
  lazy_ostream local_ad0;
  undefined1 *local_ac0;
  string **local_ab8;
  char *local_ab0;
  char *local_aa8;
  assertion_result local_aa0;
  string local_a88;
  optional<CNetAddr> net_addr;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_968;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_868;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_828;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_768;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_728;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_668;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_528;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  canonical_representations_ipv6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[3],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&net_addr,(char (*) [40])0xeb7042,(char (*) [3])0xeb503f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[30],_const_char_(&)[3],_true>
            (&local_a28,(char (*) [30])"000:0000:000:00:0:00:000:0000",(char (*) [3])0xeb503f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[3],_true>
            (&local_9e8,(char (*) [32])"000:000:000:000:000:000:000:000",(char (*) [3])0xeb503f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[3],_true>
            (&local_9a8,(char (*) [24])"00:00:00:00:00:00:00:00",(char (*) [3])0xeb503f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[3],_true>
            (&local_968,(char (*) [16])"0:0:0:0:0:0:0:0",(char (*) [3])0xeb503f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[4],_true>
            (&local_928,(char (*) [16])"0:0:0:0:0:0:0:1",(char (*) [4])0xeb2184);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_const_char_(&)[14],_true>
            (&local_8e8,(char (*) [19])"2001:0:0:1:0:0:0:1",(char (*) [14])"2001:0:0:1::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[18],_true>
            (&local_8a8,(char (*) [22])"2001:0db8:0:0:1:0:0:1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[29],_true>
            (&local_868,(char (*) [40])"2001:0db8:85a3:0000:0000:8a2e:0370:7334",
             (char (*) [29])"2001:db8:85a3::8a2e:370:7334");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[12],_true>
            (&local_828,(char (*) [16])"2001:0db8::0001",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[14],_true>
            (&local_7e8,(char (*) [21])"2001:0db8::0001:0000",(char (*) [14])"2001:db8::1:0");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_const_char_(&)[18],_true>
            (&local_7a8,(char (*) [19])"2001:0db8::1:0:0:1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[18],_true>
            (&local_768,(char (*) [21])"2001:db8:0000:0:1::1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[21],_true>
            (&local_728,(char (*) [24])"2001:db8:0000:1:1:1:1:1",
             (char (*) [21])"2001:db8:0:1:1:1:1:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[14],_true>
            (&local_6e8,(char (*) [21])"2001:db8:0:0:0:0:2:1",(char (*) [14])"2001:db8::2:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[12],_true>
            (&local_6a8,(char (*) [18])"2001:db8:0:0:0::1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[18],_true>
            (&local_668,(char (*) [21])"2001:db8:0:0:1:0:0:1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (&local_628,(char (*) [18])"2001:db8:0:0:1::1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (&local_5e8,(char (*) [18])"2001:DB8:0:0:1::1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[12],_true>
            (&local_5a8,(char (*) [16])"2001:db8:0:0::1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (&local_568,(char (*) [21])"2001:db8:0:0:aaaa::1",(char (*) [21])"2001:db8::aaaa:0:0:1")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (&local_528,(char (*) [21])"2001:db8:0:1:1:1:1:1",(char (*) [21])"2001:db8:0:1:1:1:1:1")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[12],_true>
            (&local_4e8,(char (*) [14])"2001:db8:0::1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[29],_true>
            (&local_4a8,(char (*) [32])"2001:db8:85a3:0:0:8a2e:370:7334",
             (char (*) [29])"2001:db8:85a3::8a2e:370:7334");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[12],_true>
            (&local_468,(char (*) [14])"2001:db8::0:1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[18],_true>
            (&local_428,(char (*) [20])"2001:db8::0:1:0:0:1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (&local_3e8,(char (*) [12])"2001:DB8::1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (&local_3a8,(char (*) [12])"2001:db8::1",(char (*) [12])"2001:db8::1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (&local_368,(char (*) [18])"2001:db8::1:0:0:1",(char (*) [18])"2001:db8::1:0:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[21],_true>
            (&local_328,(char (*) [20])"2001:db8::1:1:1:1:1",(char (*) [21])"2001:db8:0:1:1:1:1:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (&local_2e8,(char (*) [21])"2001:db8::aaaa:0:0:1",(char (*) [21])"2001:db8::aaaa:0:0:1")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[33],_true>
            (&local_2a8,(char (*) [33])"2001:db8:aaaa:bbbb:cccc:dddd:0:1",
             (char (*) [33])"2001:db8:aaaa:bbbb:cccc:dddd:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[33],_true>
            (&local_268,(char (*) [32])"2001:db8:aaaa:bbbb:cccc:dddd::1",
             (char (*) [33])"2001:db8:aaaa:bbbb:cccc:dddd:0:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[36],_true>
            (&local_228,(char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:0001",
             (char (*) [36])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[38],_const_char_(&)[36],_true>
            (&local_1e8,(char (*) [38])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:001",
             (char (*) [36])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[37],_const_char_(&)[36],_true>
            (&local_1a8,(char (*) [37])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:01",
             (char (*) [36])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[36],_const_char_(&)[36],_true>
            (&local_168,(char (*) [36])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1",
             (char (*) [36])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (&local_128,(char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa",
             (char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (&local_e8,(char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AAAA",
             (char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (&local_a8,(char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AaAa",
             (char (*) [39])"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa");
  __a = (allocator_type *)&local_af8;
  __l._M_len = 0x28;
  __l._M_array = (iterator)&net_addr;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&canonical_representations_ipv6,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_ad0,__a);
  lVar4 = -0xa00;
  paVar7 = &local_a8.second.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    if (&paVar7->_M_allocated_capacity + -4 != (size_type *)(&paVar7->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar7->_M_allocated_capacity)[-6],
                      (&paVar7->_M_allocated_capacity)[-4] + 1);
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -8);
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0);
  if ((_Rb_tree_header *)
      canonical_representations_ipv6._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &canonical_representations_ipv6._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = canonical_representations_ipv6._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&local_b20,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff470;
      dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
           (void *)in_stack_fffffffffffff468;
      dns_lookup_function.super__Function_base._M_manager._0_1_ = in_stack_fffffffffffff478;
      dns_lookup_function.super__Function_base._M_manager._1_7_ = in_stack_fffffffffffff479;
      dns_lookup_function._M_invoker = (_Invoker_type)in_stack_fffffffffffff480;
      LookupHost(&net_addr,(string *)(p_Var3 + 1),false,dns_lookup_function);
      if (local_b10 != (code *)0x0) {
        (*local_b10)(&local_b20,&local_b20,__destroy_functor);
      }
      local_b30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
      ;
      local_b28 = "";
      local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar8 = 0x4c02ee;
      file.m_end = (iterator)0x144;
      file.m_begin = (iterator)&local_b30;
      msg.m_end = in_R9;
      msg.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b40,msg)
      ;
      if (net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
          super__Optional_payload<CNetAddr,_true,_false,_false>.
          super__Optional_payload_base<CNetAddr>._M_engaged == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
        goto LAB_004c07a8;
      }
      local_af8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           (net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
            super__Optional_payload<CNetAddr,_true,_false,_false>.
            super__Optional_payload_base<CNetAddr>._M_payload._M_value.m_net == NET_IPV6);
      local_af8.m_message.px = (element_type *)0x0;
      local_af8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      in_stack_fffffffffffff479 = 0xeb2b;
      local_ad0.m_empty = false;
      local_ad0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_ac0 = boost::unit_test::lazy_ostream::inst;
      local_ab8 = (string **)&stack0xfffffffffffff470;
      local_b50 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
      ;
      local_b48 = "";
      pvVar5 = (iterator)0x2;
      pvVar6 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_af8,&local_ad0,2,0,WARN,_cVar8,(size_t)&local_b50,0x144);
      boost::detail::shared_count::~shared_count(&local_af8.m_message.pn);
      local_b60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
      ;
      local_b58 = "";
      local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x145;
      file_00.m_begin = (iterator)&local_b60;
      msg_00.m_end = pvVar6;
      msg_00.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b70,
                 msg_00);
      in_stack_fffffffffffff478 = false;
      in_stack_fffffffffffff470 = &PTR__lazy_ostream_013abb30;
      in_stack_fffffffffffff480 = boost::unit_test::lazy_ostream::inst;
      if (net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
          super__Optional_payload<CNetAddr,_true,_false,_false>.
          super__Optional_payload_base<CNetAddr>._M_engaged == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
        goto LAB_004c07a8;
      }
      CNetAddr::ToStringAddr_abi_cxx11_(&local_a88,(CNetAddr *)&net_addr);
      if ((_Base_ptr)local_a88._M_string_length == p_Var3[2]._M_parent) {
        if ((_Base_ptr)local_a88._M_string_length == (_Base_ptr)0x0) {
          local_aa0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x1;
        }
        else {
          iVar2 = bcmp(local_a88._M_dataplus._M_p,*(void **)(p_Var3 + 2),local_a88._M_string_length)
          ;
          local_aa0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar2 == 0);
        }
      }
      else {
        local_aa0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
      }
      local_aa0.m_message.px = (element_type *)0x0;
      local_aa0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_ab0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
      ;
      local_aa8 = "";
      local_ad8 = &local_a88;
      local_ad0.m_empty = false;
      local_ad0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbf0;
      local_ac0 = boost::unit_test::lazy_ostream::inst;
      local_ab8 = &local_ad8;
      local_af8.m_message.px = (element_type *)((ulong)local_af8.m_message.px & 0xffffffffffffff00);
      local_af8._0_8_ = &PTR__lazy_ostream_013abbf0;
      local_af8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_ae0 = &local_b00;
      __a = (allocator_type *)0x1;
      in_R9 = (iterator)0x2;
      local_b00 = p_Var3 + 2;
      boost::test_tools::tt_detail::report_assertion
                (&local_aa0,(lazy_ostream *)&stack0xfffffffffffff470,1,2,REQUIRE,0xeb2b86,
                 (size_t)&local_ab0,0x145,&local_ad0,"expected_canonical_representation_output",
                 &local_af8);
      boost::detail::shared_count::~shared_count(&local_aa0.m_message.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
           super__Optional_payload<CNetAddr,_true,_false,_false>.
           super__Optional_payload_base<CNetAddr>._M_engaged == true) &&
         (net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
          super__Optional_payload<CNetAddr,_true,_false,_false>.
          super__Optional_payload_base<CNetAddr>._M_engaged = false,
         0x10 < net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
                super__Optional_payload<CNetAddr,_true,_false,_false>.
                super__Optional_payload_base<CNetAddr>._M_payload._M_value.m_addr._size)) {
        free((void *)net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
                     super__Optional_payload<CNetAddr,_true,_false,_false>.
                     super__Optional_payload_base<CNetAddr>._M_payload._0_8_);
        net_addr.super__Optional_base<CNetAddr,_false,_false>._M_payload.
        super__Optional_payload<CNetAddr,_true,_false,_false>.super__Optional_payload_base<CNetAddr>
        ._M_payload._0_8_ = 0;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 !=
             &canonical_representations_ipv6._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&canonical_representations_ipv6._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_004c07a8:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_tostring_canonical_ipv6)
{
    // Test that CNetAddr::ToString formats IPv6 addresses with zero compression as described in
    // RFC 5952 ("A Recommendation for IPv6 Address Text Representation").
    const std::map<std::string, std::string> canonical_representations_ipv6{
        {"0000:0000:0000:0000:0000:0000:0000:0000", "::"},
        {"000:0000:000:00:0:00:000:0000", "::"},
        {"000:000:000:000:000:000:000:000", "::"},
        {"00:00:00:00:00:00:00:00", "::"},
        {"0:0:0:0:0:0:0:0", "::"},
        {"0:0:0:0:0:0:0:1", "::1"},
        {"2001:0:0:1:0:0:0:1", "2001:0:0:1::1"},
        {"2001:0db8:0:0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:0db8:85a3:0000:0000:8a2e:0370:7334", "2001:db8:85a3::8a2e:370:7334"},
        {"2001:0db8::0001", "2001:db8::1"},
        {"2001:0db8::0001:0000", "2001:db8::1:0"},
        {"2001:0db8::1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8:0000:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:db8:0000:1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8:0:0:0:0:2:1", "2001:db8::2:1"},
        {"2001:db8:0:0:0::1", "2001:db8::1"},
        {"2001:db8:0:0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8:0:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:DB8:0:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:db8:0:0::1", "2001:db8::1"},
        {"2001:db8:0:0:aaaa::1", "2001:db8::aaaa:0:0:1"},
        {"2001:db8:0:1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8:0::1", "2001:db8::1"},
        {"2001:db8:85a3:0:0:8a2e:370:7334", "2001:db8:85a3::8a2e:370:7334"},
        {"2001:db8::0:1", "2001:db8::1"},
        {"2001:db8::0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:DB8::1", "2001:db8::1"},
        {"2001:db8::1", "2001:db8::1"},
        {"2001:db8::1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8::1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8::aaaa:0:0:1", "2001:db8::aaaa:0:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:0:1", "2001:db8:aaaa:bbbb:cccc:dddd:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd::1", "2001:db8:aaaa:bbbb:cccc:dddd:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:0001", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:001", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:01", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AAAA", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AaAa", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
    };
    for (const auto& [input_address, expected_canonical_representation_output] : canonical_representations_ipv6) {
        const std::optional<CNetAddr> net_addr{LookupHost(input_address, false)};
        BOOST_REQUIRE(net_addr.value().IsIPv6());
        BOOST_CHECK_EQUAL(net_addr.value().ToStringAddr(), expected_canonical_representation_output);
    }
}